

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O2

void SHtest(double *x,int N,int *f,int Nseas,double *season)

{
  double **seasonal;
  double *trend;
  double *remainder;
  double *vec;
  ulong uVar1;
  ulong uVar2;
  size_t __nmemb;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  uint local_4c;
  int *piStack_48;
  int Niter;
  ulong local_40;
  uint local_34;
  
  local_40 = CONCAT44(local_40._4_4_,Nseas);
  piStack_48 = f;
  seasonal = (double **)calloc((long)Nseas,8);
  __nmemb = (size_t)N;
  uVar3 = 0;
  uVar2 = 0;
  local_34 = N;
  if (0 < Nseas) {
    uVar2 = local_40 & 0xffffffff;
  }
  for (; trend = (double *)calloc(__nmemb,8), uVar2 != uVar3; uVar3 = uVar3 + 1) {
    seasonal[uVar3] = trend;
  }
  remainder = (double *)calloc(__nmemb,8);
  vec = (double *)calloc(__nmemb,8);
  local_4c = (uint)local_40;
  uVar4 = 0;
  mstl(x,N,piStack_48,(int *)&local_4c,(int *)0x0,(double *)0x0,(int *)0x0,seasonal,trend,remainder)
  ;
  piStack_48 = (int *)var(remainder,N);
  uVar3 = 0;
  if (0 < N) {
    uVar3 = (ulong)local_34;
  }
  local_40 = (ulong)local_4c;
  if ((int)local_4c < 1) {
    local_40 = uVar4;
  }
  for (; uVar4 != local_40; uVar4 = uVar4 + 1) {
    for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      vec[uVar1] = remainder[uVar1] + seasonal[uVar4][uVar1];
    }
    dVar5 = var(vec,local_34);
    dVar5 = 1.0 - (double)piStack_48 / dVar5;
    if (1.0 <= dVar5) {
      dVar5 = 1.0;
    }
    if (dVar5 <= 0.0) {
      dVar5 = 0.0;
    }
    season[uVar4] = dVar5;
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    free(seasonal[uVar3]);
  }
  free(seasonal);
  free(trend);
  free(remainder);
  free(vec);
  return;
}

Assistant:

void SHtest(double *x, int N, int *f, int Nseas, double *season) {
    /*
    Seasonal Heuristic Test
    */
    int i,j,Niter;
    double **seasonal, *trend, *remainder, *vari;
    double vare,tmp1;

    seasonal = (double**)calloc(Nseas,sizeof(double*));
    for(i = 0; i < Nseas;++i) {
        seasonal[i] = (double*)calloc(N,sizeof(double));
    }
    trend = (double*)calloc(N,sizeof(double));
    remainder = (double*)calloc(N,sizeof(double));
    vari = (double*)calloc(N,sizeof(double));

    /// memory leak fix, copy Nseas to Niter then pass address 
    /// of Niter to mstl as mstl has potential of modifying Niter
    /// which affects freeing of seasonal double array below
    Niter = Nseas;
    mstl(x, N,f,&Niter,NULL,NULL,NULL,seasonal,trend,remainder);

    vare = var(remainder,N);

    for(j = 0; j < Niter; ++j) {

        for(i = 0; i < N;++i) {
            vari[i] = remainder[i] + seasonal[j][i];
        }

        tmp1 = 1.0 - vare/var(vari,N);

        tmp1 = tmp1 < 1 ? tmp1 : 1;

        season[j] = tmp1 > 0 ? tmp1 : 0;

    }
    
    for(i = 0; i < Nseas;++i) {
        free(seasonal[i]);
    }

    free(seasonal);
    free(trend);
    free(remainder);
    free(vari);
}